

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

char ** SoapySDRDevice_listGPIOBanks(SoapySDRDevice *device,size_t *length)

{
  undefined1 *puVar1;
  char **ppcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_28;
  
  *length = 0;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x360))(&vStack_28,device);
  ppcVar2 = toStrArray(&vStack_28,length,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_28);
  return ppcVar2;
}

Assistant:

char **SoapySDRDevice_listGPIOBanks(const SoapySDRDevice *device, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toStrArray(device->listGPIOBanks(), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}